

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderUtil.cpp
# Opt level: O0

bool glu::glslVersionIsES(GLSLVersion version)

{
  undefined1 local_9;
  GLSLVersion version_local;
  
  if ((((version == GLSL_VERSION_100_ES) || (version == GLSL_VERSION_300_ES)) ||
      (version == GLSL_VERSION_310_ES)) || (version == GLSL_VERSION_320_ES)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool glslVersionIsES (GLSLVersion version)
{
	DE_STATIC_ASSERT(GLSL_VERSION_LAST == 14);
	DE_ASSERT(version != GLSL_VERSION_LAST);

	if (version == GLSL_VERSION_100_ES	||
		version == GLSL_VERSION_300_ES	||
		version == GLSL_VERSION_310_ES	||
		version == GLSL_VERSION_320_ES)
		return true;
	else
		return false;
}